

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreationTest.cpp
# Opt level: O0

void __thiscall
TApp_MultipleSubcomMatchingWithCase_Test::TApp_MultipleSubcomMatchingWithCase_Test
          (TApp_MultipleSubcomMatchingWithCase_Test *this)

{
  TApp_MultipleSubcomMatchingWithCase_Test *this_local;
  
  TApp::TApp(&this->super_TApp);
  (this->super_TApp).super_Test._vptr_Test =
       (_func_int **)&PTR__TApp_MultipleSubcomMatchingWithCase_Test_001bf890;
  return;
}

Assistant:

TEST_F(TApp, MultipleSubcomMatchingWithCase) {
    app.add_subcommand("first")->ignore_case();
    EXPECT_THROW(app.add_subcommand("fIrst"), CLI::OptionAlreadyAdded);
}